

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_ManFindCommonPairs
               (Vec_Wec_t *vCubes,Vec_Int_t *vPart0,Vec_Int_t *vPart1,Vec_Int_t *vPairs,
               Vec_Int_t *vCompls,Vec_Int_t *vDiv,Vec_Int_t *vCubeFree,int *fWarning)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *fWarning_00;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  uint *puVar14;
  Vec_Int_t *local_80;
  uint *local_78;
  ulong local_60;
  
  puVar14 = (uint *)vPart0->pArray;
  puVar7 = (uint *)vPart1->pArray;
  iVar4 = vPart0->nSize;
  iVar3 = vPart1->nSize;
  vPairs->nSize = 0;
  vCompls->nSize = 0;
  if (0 < iVar3 && 0 < (long)iVar4) {
    puVar1 = puVar14 + iVar4;
    puVar2 = puVar7 + iVar3;
    do {
      lVar6 = (long)(int)*puVar14;
      if ((lVar6 < 0) || (uVar5 = vCubes->nSize, (int)uVar5 <= (int)*puVar14)) {
LAB_002688cf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      fWarning_00 = vCubes->pArray;
      if (fWarning_00[lVar6].nSize < 1) {
LAB_002688ee:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar9 = (long)(int)*puVar7;
      if ((lVar9 < 0) || (uVar5 <= *puVar7)) goto LAB_002688cf;
      if (fWarning_00[lVar9].nSize < 1) goto LAB_002688ee;
      iVar4 = *fWarning_00[lVar6].pArray;
      if (iVar4 == *fWarning_00[lVar9].pArray) {
        puVar12 = puVar14 + 1;
        pVVar10 = (Vec_Int_t *)0x1;
        local_60 = 1;
        if (puVar12 < puVar1) {
          do {
            uVar8 = (uint)pVVar10;
            lVar6 = (long)(int)*puVar12;
            if ((lVar6 < 0) || (uVar5 <= *puVar12)) goto LAB_002688cf;
            if (fWarning_00[lVar6].nSize < 1) goto LAB_002688ee;
            if (iVar4 != *fWarning_00[lVar6].pArray) break;
            pVVar10 = (Vec_Int_t *)((long)&pVVar10->nCap + 1);
            uVar8 = (uint)pVVar10;
            puVar12 = puVar12 + 1;
          } while (puVar12 < puVar1);
          pVVar10 = (Vec_Int_t *)(ulong)uVar8;
        }
        local_78 = puVar7 + 1;
        if (local_78 < puVar2) {
          local_60 = 1;
          do {
            lVar6 = (long)(int)*local_78;
            if ((lVar6 < 0) || (uVar5 <= *local_78)) goto LAB_002688cf;
            if (fWarning_00[lVar6].nSize < 1) goto LAB_002688ee;
            if (iVar4 != *fWarning_00[lVar6].pArray) break;
            local_60 = local_60 + 1;
            local_78 = local_78 + 1;
          } while (local_78 < puVar2);
          local_60 = local_60 & 0xffffffff;
        }
        local_80 = (Vec_Int_t *)0x0;
        do {
          uVar13 = 0;
          do {
            uVar5 = puVar14[(long)local_80];
            uVar8 = puVar7[uVar13];
            if (uVar5 != uVar8) {
              if (((((int)uVar5 < 0) || (vCubes->nSize <= (int)uVar5)) || ((int)uVar8 < 0)) ||
                 ((uint)vCubes->nSize <= uVar8)) goto LAB_002688cf;
              Fx_ManDivFindCubeFree
                        (vCubes->pArray + uVar5,vCubes->pArray + uVar8,vCubeFree,&fWarning_00->nCap)
              ;
              uVar5 = vCubeFree->nSize;
              uVar8 = 0;
              if (uVar5 == 4) {
                iVar4 = Fx_ManDivNormalize((Vec_Int_t *)&DAT_00000004);
                uVar8 = (uint)(iVar4 == 1);
                uVar5 = vCubeFree->nSize;
              }
              fWarning_00 = vDiv;
              if (vDiv->nSize == uVar5) {
                if (0 < (int)uVar5) {
                  fWarning_00 = (Vec_Int_t *)vDiv->pArray;
                  uVar11 = 0;
                  do {
                    if ((&fWarning_00->nCap)[uVar11] != vCubeFree->pArray[uVar11])
                    goto LAB_00268878;
                    uVar11 = uVar11 + 1;
                  } while (uVar5 != uVar11);
                }
                Vec_IntPush(vPairs,puVar14[(long)local_80]);
                Vec_IntPush(vPairs,puVar7[uVar13]);
                Vec_IntPush(vCompls,uVar8);
              }
            }
LAB_00268878:
            uVar13 = uVar13 + 1;
          } while (uVar13 != local_60);
          fWarning_00 = (Vec_Int_t *)((long)&local_80->nCap + 1);
          local_80 = fWarning_00;
        } while (fWarning_00 != pVVar10);
      }
      else if (iVar4 < *fWarning_00[lVar9].pArray) {
        local_78 = puVar7;
        puVar12 = puVar14 + 1;
      }
      else {
        local_78 = puVar7 + 1;
        puVar12 = puVar14;
      }
    } while ((puVar12 < puVar1) && (puVar7 = local_78, puVar14 = puVar12, local_78 < puVar2));
  }
  return;
}

Assistant:

void Fx_ManFindCommonPairs( Vec_Wec_t * vCubes, Vec_Int_t * vPart0, Vec_Int_t * vPart1, Vec_Int_t * vPairs, Vec_Int_t * vCompls, Vec_Int_t * vDiv, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vPart0->pArray;
    int * pBeg2 = vPart1->pArray;
    int * pEnd1 = vPart0->pArray + vPart0->nSize;
    int * pEnd2 = vPart1->pArray + vPart1->nSize;
    int i, k, i_, k_, fCompl, CubeId1, CubeId2;
    Vec_IntClear( vPairs );
    Vec_IntClear( vCompls );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        CubeId1 = Fx_ManGetCubeVar(vCubes, *pBeg1);
        CubeId2 = Fx_ManGetCubeVar(vCubes, *pBeg2);
        if ( CubeId1 == CubeId2 )
        {
            for ( i = 1; pBeg1+i < pEnd1; i++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg1[i]) )
                    break;
            for ( k = 1; pBeg2+k < pEnd2; k++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg2[k]) )
                    break;
            for ( i_ = 0; i_ < i; i_++ )
            for ( k_ = 0; k_ < k; k_++ )
            {
                if ( pBeg1[i_] == pBeg2[k_] )
                    continue;
                Fx_ManDivFindCubeFree( Vec_WecEntry(vCubes, pBeg1[i_]), Vec_WecEntry(vCubes, pBeg2[k_]), vCubeFree, fWarning );
                fCompl = (Vec_IntSize(vCubeFree) == 4 && Fx_ManDivNormalize(vCubeFree) == 1);
                if ( !Vec_IntEqual( vDiv, vCubeFree ) )
                    continue;
                Vec_IntPush( vPairs, pBeg1[i_] );
                Vec_IntPush( vPairs, pBeg2[k_] );
                Vec_IntPush( vCompls, fCompl );
            }
            pBeg1 += i;
            pBeg2 += k;
        }
        else if ( CubeId1 < CubeId2 )
            pBeg1++;
        else 
            pBeg2++;
    }
}